

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::Picker::insertItem(Picker *this,int index,QString *text,QVariant *userData)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  QVariant *pQVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  QStandardItem *this_00;
  uint start;
  int iVar7;
  QMap<int,_QVariant> values;
  QModelIndex item;
  QMap<int,_QVariant> local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QVariant *local_58;
  key_type local_4c;
  QStandardItem *local_48 [3];
  
  pPVar1 = (this->d).d;
  pQVar2 = pPVar1->model;
  local_58 = userData;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,&pPVar1->root);
  uVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_78);
  if ((int)uVar5 < index) {
    index = uVar5;
  }
  start = 0;
  if (0 < index) {
    start = index;
  }
  if (((this->d).d)->maxCount <= (int)start) {
    return;
  }
  lVar6 = QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
  if (lVar6 == 0) {
    pPVar1 = (this->d).d;
    pPVar1->inserting = true;
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,&pPVar1->root);
    cVar4 = (**(code **)(*(long *)pQVar2 + 0xf8))(pQVar2,start,1,&local_78);
    if (cVar4 == '\0') {
      ((this->d).d)->inserting = false;
      goto LAB_0016f03b;
    }
    pPVar1 = (this->d).d;
    pQVar2 = pPVar1->model;
    iVar7 = pPVar1->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,&pPVar1->root);
    (**(code **)(*(long *)pQVar2 + 0x60))(local_48,pQVar2,start,iVar7,&local_78);
    local_78.shared = (PrivateShared *)(*(ulong *)&(local_58->d).field_0x18 & 0xfffffffffffffffc);
    cVar4 = QMetaType::isValid();
    if (cVar4 == '\0') {
      pQVar2 = ((this->d).d)->model;
      QVariant::QVariant((QVariant *)&local_78,text);
      (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,local_48,&local_78,0);
      QVariant::~QVariant((QVariant *)&local_78);
    }
    else {
      local_80.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0x0;
      if ((text->d).ptr != (char16_t *)0x0) {
        local_4c = 0;
        QVariant::QVariant((QVariant *)&local_78,text);
        QMap<int,_QVariant>::detach(&local_80);
        std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
        insert_or_assign<QVariant_const&>
                  ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>> *
                   )((long)local_80.d.d + 8),&local_4c,(QVariant *)&local_78);
        QVariant::~QVariant((QVariant *)&local_78);
      }
      pQVar3 = local_58;
      local_78.shared = (PrivateShared *)(*(ulong *)&(local_58->d).field_0x18 & 0xfffffffffffffffc);
      cVar4 = QMetaType::isValid();
      if (cVar4 != '\0') {
        local_78._0_4_ = 0x100;
        QMap<int,_QVariant>::detach(&local_80);
        std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
        insert_or_assign<QVariant_const&>
                  ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>> *
                   )((long)local_80.d.d + 8),(key_type *)local_78.data,pQVar3);
      }
      if ((local_80.d.d !=
           (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)0x0) && (*(size_t *)((long)local_80.d.d + 0x30) != 0)) {
        pQVar2 = ((this->d).d)->model;
        (**(code **)(*(long *)pQVar2 + 0xb8))(pQVar2,local_48,&local_80);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_80.d);
    }
    pPVar1 = (this->d).d;
    pPVar1->inserting = false;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,&pPVar1->root);
    _q_rowsInserted(this,(QModelIndex *)&local_78,start,start);
  }
  else {
    this_00 = (QStandardItem *)operator_new(0x10);
    QStandardItem::QStandardItem(this_00,text);
    pQVar3 = local_58;
    local_78.shared = (PrivateShared *)(*(ulong *)&(local_58->d).field_0x18 & 0xfffffffffffffffc);
    cVar4 = QMetaType::isValid();
    if (cVar4 != '\0') {
      (**(code **)(*(long *)this_00 + 0x20))(this_00,pQVar3,0x100);
    }
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_48[0] = this_00;
    QtPrivate::QPodArrayOps<QStandardItem*>::emplace<QStandardItem*&>
              ((QPodArrayOps<QStandardItem*> *)local_78.data,0,local_48);
    QStandardItemModel::insertRow((int)lVar6,(QList *)(ulong)start);
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,8,8);
      }
    }
  }
  uVar5 = uVar5 + 1;
LAB_0016f03b:
  pPVar1 = (this->d).d;
  iVar7 = uVar5 - pPVar1->maxCount;
  if (iVar7 != 0 && pPVar1->maxCount <= (int)uVar5) {
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_78,&pPVar1->root);
    (**(code **)(*(long *)pQVar2 + 0x108))(pQVar2,uVar5 - 1,iVar7,&local_78);
  }
  return;
}

Assistant:

void
Picker::insertItem( int index, const QString & text, const QVariant & userData )
{
	int itemCount = count();

	index = qBound( 0, index, itemCount );

	if( index >= d->maxCount )
		return;

	// For the common case where we are using the built in QStandardItemModel
	// construct a QStandardItem, reducing the number of expensive signals from
	// the model
	if( QStandardItemModel * m = qobject_cast< QStandardItemModel* > ( d->model ) )
	{
		QStandardItem * item = new QStandardItem( text );
		if( userData.isValid() ) item->setData( userData, Qt::UserRole );
		m->insertRow( index, item );
		++itemCount;
	}
	else
	{
		d->inserting = true;

		if( d->model->insertRows( index, 1, d->root ) )
		{
			QModelIndex item = d->model->index( index, d->modelColumn, d->root );

			if( !userData.isValid() )
				d->model->setData( item, text, Qt::DisplayRole );
			else
			{
				QMap< int, QVariant > values;

				if( !text.isNull() ) values.insert( Qt::DisplayRole, text );
				if( userData.isValid() ) values.insert( Qt::UserRole, userData );
				if( !values.isEmpty() ) d->model->setItemData( item, values );
			}

			d->inserting = false;

			_q_rowsInserted( d->root, index, index );

			++itemCount;
		}
		else
			d->inserting = false;
	}

	if( itemCount > d->maxCount )
		d->model->removeRows( itemCount - 1, itemCount - d->maxCount, d->root );
}